

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O1

pair<unsigned_long,_unsigned_long>
beast::detail::base64::decode<void>(void *dest,char *src,size_t len)

{
  byte bVar1;
  void *pvVar2;
  ulong uVar3;
  byte *pbVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  byte local_f [8];
  uchar c3 [3];
  uchar c4 [4];
  
  iVar5 = 0;
  pvVar2 = dest;
  pbVar4 = (byte *)src;
  do {
    bVar7 = len == 0;
    len = len - 1;
    if ((bVar7) || ((ulong)*pbVar4 == 0x3d)) break;
    bVar1 = get_inverse()::tab[*pbVar4];
    if (bVar1 != 0xff) {
      pbVar4 = pbVar4 + 1;
      local_f[(long)iVar5 + 3] = bVar1;
      iVar5 = iVar5 + 1;
      if (iVar5 == 4) {
        local_f[0] = local_f[4] >> 4 & 3 | local_f[3] << 2;
        local_f[1] = local_f[5] >> 2 & 0xf | local_f[4] << 4;
        local_f[2] = local_f[5] * '@' + local_f[6];
        lVar6 = 0;
        do {
          *(byte *)((long)pvVar2 + lVar6) = local_f[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        pvVar2 = (void *)((long)pvVar2 + 3);
        iVar5 = 0;
      }
    }
  } while (bVar1 != 0xff);
  if (iVar5 != 0) {
    local_f[0] = local_f[4] >> 4 & 3 | local_f[3] << 2;
    local_f[1] = local_f[5] >> 2 & 0xf | local_f[4] << 4;
    local_f[2] = local_f[5] * '@' + local_f[6];
    if (1 < iVar5) {
      uVar3 = 0;
      do {
        *(byte *)((long)pvVar2 + uVar3) = local_f[uVar3];
        uVar3 = uVar3 + 1;
      } while (iVar5 - 1 != uVar3);
      pvVar2 = (void *)((long)pvVar2 + uVar3);
    }
  }
  pVar8.first = (long)pvVar2 - (long)dest;
  pVar8.second = (long)pbVar4 - (long)src;
  return pVar8;
}

Assistant:

std::pair<std::size_t, std::size_t>
decode(void* dest, char const* src, std::size_t len)
{
    char* out = static_cast<char*>(dest);
    auto in = reinterpret_cast<unsigned char const*>(src);
    unsigned char c3[3], c4[4];
    int i = 0;
    int j = 0;

    auto const inverse = base64::get_inverse();

    while(len-- && *in != '=')
    {
        auto const v = inverse[*in];
        if(v == -1)
            break;
        ++in;
        c4[i] = v;
        if(++i == 4)
        {
            c3[0] =  (c4[0]        << 2) + ((c4[1] & 0x30) >> 4);
            c3[1] = ((c4[1] & 0xf) << 4) + ((c4[2] & 0x3c) >> 2);
            c3[2] = ((c4[2] & 0x3) << 6) +   c4[3];

            for(i = 0; i < 3; i++)
                *out++ = c3[i];
            i = 0;
        }
    }

    if(i)
    {
        c3[0] = ( c4[0]        << 2) + ((c4[1] & 0x30) >> 4);
        c3[1] = ((c4[1] & 0xf) << 4) + ((c4[2] & 0x3c) >> 2);
        c3[2] = ((c4[2] & 0x3) << 6) +   c4[3];

        for(j = 0; j < i - 1; j++)
            *out++ = c3[j];
    }

    return {out - static_cast<char*>(dest),
        in - reinterpret_cast<unsigned char const*>(src)};
}